

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

Float pbrt::SpectrumToPhotometric(SpectrumHandle *s)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  float lambda;
  Float FVar3;
  undefined1 auVar4 [64];
  float fVar5;
  undefined1 extraout_var [60];
  
  uVar1 = (s->
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          ).bits;
  if ((short)(uVar1 >> 0x30) == 4) {
    (s->
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    ).bits = *(ulong *)((uVar1 & 0xffffffffffff) + 0x20) | 0x2000000000000;
  }
  fVar5 = 0.0;
  for (lambda = 360.0; lambda <= 830.0; lambda = lambda + 1.0) {
    FVar3 = DenselySampledSpectrum::operator()(Spectra::y,lambda);
    auVar4._0_4_ = SpectrumHandle::operator()(s,lambda);
    auVar4._4_60_ = extraout_var;
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)fVar5),auVar4._0_16_,ZEXT416((uint)FVar3));
    fVar5 = auVar2._0_4_;
  }
  return fVar5 * 683.0;
}

Assistant:

Float SpectrumToPhotometric(SpectrumHandle s) {
    // We have to handle RGBSpectrum separately here as it's composed of an
    // illuminant spectrum and an RGB multiplier. We only want to consider the
    // illuminant for the sake of this calculation, and we should consider the
    // RGB separately for the purposes of target power/illuminance computation
    // in the lights themselves (but we currently don't)
    if (s.Is<RGBSpectrum>())
        s = s.Cast<RGBSpectrum>()->Illluminant();

    Float y = 0;
    for (Float lambda = Lambda_min; lambda <= Lambda_max; ++lambda)
        y += Spectra::Y()(lambda) * s(lambda);

    return y * K_m;
}